

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertWeakNode
          (CollationBuilder *this,int32_t index,uint32_t weight16,int32_t level,
          UErrorCode *errorCode)

{
  uint uVar1;
  int32_t iVar2;
  uint uVar3;
  ulong uVar4;
  ulong node;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar3 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (weight16 == 0x500) {
      iVar2 = findCommonNode(this,index,level);
      return iVar2;
    }
    node = 0;
    if ((-1 < index) && (index < (this->nodes).count)) {
      node = (this->nodes).elements[(uint)index];
    }
    uVar3 = weight16 - 1;
    if (uVar3 < 0x4ff) {
      uVar10 = (ulong)(level == 1) * 0x20 + 0x20;
      uVar9 = (uint)node;
      uVar5 = (uint)uVar10;
      if ((uVar9 & uVar5) == 0) {
        uVar4 = 0;
        if (level == 1) {
          uVar4 = (ulong)(uVar9 & 0x20);
        }
        uVar6 = node & 0xffffffffffffffdf;
        if (level != 1) {
          uVar6 = node;
        }
        UVector64::setElementAt(&this->nodes,uVar6 | uVar10,index);
        uVar3 = (uint)(uVar6 >> 8) & 0xfffff;
        node = (ulong)weight16 << 0x30 | (long)level;
        index = insertNodeBetween(this,index,uVar3,node,errorCode);
        insertNodeBetween(this,index,uVar3,(long)level | 0x500000000000000U | uVar4,errorCode);
        uVar3 = index;
      }
      if ((uVar9 & uVar5) == 0) {
        return uVar3;
      }
    }
    uVar9 = uVar3;
    do {
      uVar5 = (uint)(node >> 8) & 0xfffff;
      if ((node >> 8 & 0xfffff) == 0) goto LAB_0022e7b3;
      if ((int)uVar5 < (this->nodes).count) {
        node = (this->nodes).elements[uVar5];
      }
      else {
        node = 0;
      }
      uVar8 = (uint)node & 3;
      cVar7 = '\0';
      uVar1 = uVar5;
      if ((int)uVar8 <= level) {
        if ((int)uVar8 < level) {
          cVar7 = '\x03';
          uVar1 = index;
        }
        else if ((node & 8) == 0) {
          uVar8 = (uint)(ushort)(node >> 0x30);
          uVar3 = uVar9;
          cVar7 = (weight16 < uVar8) * '\x03';
          if (uVar8 == weight16) {
            uVar3 = uVar5;
            cVar7 = '\x01';
          }
          uVar1 = index;
          uVar9 = uVar3;
          if (uVar8 < weight16) {
            cVar7 = '\0';
            uVar1 = uVar5;
          }
        }
      }
      index = uVar1;
    } while (cVar7 == '\0');
    if (cVar7 == '\x03') {
LAB_0022e7b3:
      iVar2 = insertNodeBetween(this,index,uVar5,(long)level | (ulong)weight16 << 0x30,errorCode);
      return iVar2;
    }
  }
  return uVar3;
}

Assistant:

int32_t
CollationBuilder::findOrInsertWeakNode(int32_t index, uint32_t weight16, int32_t level, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    U_ASSERT(0 <= index && index < nodes.size());
    U_ASSERT(UCOL_SECONDARY <= level && level <= UCOL_TERTIARY);

    if(weight16 == Collation::COMMON_WEIGHT16) {
        return findCommonNode(index, level);
    }

    // If this will be the first below-common weight for the parent node,
    // then we will also need to insert a common weight after it.
    int64_t node = nodes.elementAti(index);
    U_ASSERT(strengthFromNode(node) < level);  // parent node is stronger
    if(weight16 != 0 && weight16 < Collation::COMMON_WEIGHT16) {
        int32_t hasThisLevelBefore = level == UCOL_SECONDARY ? HAS_BEFORE2 : HAS_BEFORE3;
        if((node & hasThisLevelBefore) == 0) {
            // The parent node has an implied level-common weight.
            int64_t commonNode =
                nodeFromWeight16(Collation::COMMON_WEIGHT16) | nodeFromStrength(level);
            if(level == UCOL_SECONDARY) {
                // Move the HAS_BEFORE3 flag from the parent node
                // to the new secondary common node.
                commonNode |= node & HAS_BEFORE3;
                node &= ~(int64_t)HAS_BEFORE3;
            }
            nodes.setElementAt(node | hasThisLevelBefore, index);
            // Insert below-common-weight node.
            int32_t nextIndex = nextIndexFromNode(node);
            node = nodeFromWeight16(weight16) | nodeFromStrength(level);
            index = insertNodeBetween(index, nextIndex, node, errorCode);
            // Insert common-weight node.
            insertNodeBetween(index, nextIndex, commonNode, errorCode);
            // Return index of below-common-weight node.
            return index;
        }
    }

    // Find the root CE's weight for this level.
    // Postpone insertion if not found:
    // Insert the new root node before the next stronger node,
    // or before the next root node with the same strength and a larger weight.
    int32_t nextIndex;
    while((nextIndex = nextIndexFromNode(node)) != 0) {
        node = nodes.elementAti(nextIndex);
        int32_t nextStrength = strengthFromNode(node);
        if(nextStrength <= level) {
            // Insert before a stronger node.
            if(nextStrength < level) { break; }
            // nextStrength == level
            if(!isTailoredNode(node)) {
                uint32_t nextWeight16 = weight16FromNode(node);
                if(nextWeight16 == weight16) {
                    // Found the node for the root CE up to this level.
                    return nextIndex;
                }
                // Insert before a node with a larger same-strength weight.
                if(nextWeight16 > weight16) { break; }
            }
        }
        // Skip the next node.
        index = nextIndex;
    }
    node = nodeFromWeight16(weight16) | nodeFromStrength(level);
    return insertNodeBetween(index, nextIndex, node, errorCode);
}